

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O0

void __thiscall Game::setTeams(Game *this)

{
  Player *pPVar1;
  Team *pTVar2;
  reference ppPVar3;
  allocator local_79;
  string local_78 [40];
  Team *team2;
  allocator local_39;
  string local_38 [32];
  Team *local_18;
  Team *team1;
  Game *this_local;
  
  team1 = (Team *)this;
  pTVar2 = (Team *)operator_new(0x58);
  team2._3_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"Team 1",&local_39);
  ppPVar3 = std::array<Player_*,_4UL>::operator[](&this->_players,0);
  pPVar1 = *ppPVar3;
  ppPVar3 = std::array<Player_*,_4UL>::operator[](&this->_players,2);
  Team::Team(pTVar2,(string *)local_38,pPVar1,*ppPVar3);
  team2._3_1_ = 0;
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pTVar2;
  pTVar2 = (Team *)operator_new(0x58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"Team 2",&local_79);
  ppPVar3 = std::array<Player_*,_4UL>::operator[](&this->_players,1);
  pPVar1 = *ppPVar3;
  ppPVar3 = std::array<Player_*,_4UL>::operator[](&this->_players,3);
  Team::Team(pTVar2,(string *)local_78,pPVar1,*ppPVar3);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  (this->_teams)._M_elems[0] = local_18;
  (this->_teams)._M_elems[1] = pTVar2;
  return;
}

Assistant:

void Game::setTeams() {
    Team *team1 = new Team("Team 1", _players[0], _players[2]);
    Team *team2 = new Team("Team 2", _players[1], _players[3]);
    _teams = {team1, team2};
}